

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int loop_invariant_p(gen_ctx_t gen_ctx,loop_node_t_conflict loop,bb_insn_t_conflict bb_insn,
                    bitmap_t loop_invariant_insn_bitmap)

{
  uint uVar1;
  bb_insn_t pbVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  loop_node_t plVar7;
  ulong uVar8;
  bb_t_conflict *ppbVar9;
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  int local_60;
  MIR_reg_t local_5c;
  ulong local_58;
  insn_var_iterator_t local_50;
  
  uVar6 = bb_insn->gvn_val;
  iVar5 = 0;
  uVar1 = (uint)uVar6;
  iVar4 = 0;
  if (((uVar1 - 0xa5 < 0xffffffd1) &&
      ((((iVar4 = iVar5, 0x14 < uVar1 - 0xa6 || ((0x104071U >> (uVar1 - 0xa6 & 0x1f) & 1) == 0)) &&
        (uVar1 - 0xaa < 0xfffffffd)) &&
       ((0x3b < uVar1 || ((0xf1e000000000000U >> (uVar6 & 0x3f) & 1) == 0)))))) &&
     (6 < uVar1 - 0xad)) {
    if (uVar6 >> 0x20 == 0) {
      local_50.nops = 0;
    }
    else {
      ppbVar9 = &bb_insn->bb;
      uVar8 = 0;
      do {
        if (*(char *)(ppbVar9 + -1) == '\x02') {
          local_58 = uVar8;
          iVar4 = bitmap_bit_p(gen_ctx->tied_regs,(ulong)*(uint *)ppbVar9);
          if (iVar4 != 0) {
            return 0;
          }
          uVar6 = bb_insn->gvn_val;
          uVar8 = local_58;
        }
        else if (*(char *)(ppbVar9 + -1) == '\v') {
          return 0;
        }
        uVar8 = uVar8 + 1;
        local_50.nops = uVar6 >> 0x20;
        ppbVar9 = ppbVar9 + 6;
      } while (uVar8 < local_50.nops);
    }
    local_50.op_num = 0;
    local_50.op_part_num = 0;
    local_50.insn = (MIR_insn_t)bb_insn;
    iVar5 = input_insn_var_iterator_next(gen_ctx,&local_50,&local_5c,&local_60);
    iVar4 = 1;
    if (iVar5 != 0) {
      do {
        pbVar2 = (&bb_insn->bb_insn_link)[(long)local_60 * 3].prev;
        if (pbVar2 == (bb_insn_t)0x0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        lVar3 = *(long *)&pbVar2->gvn_val_const_p;
        if (loop_invariant_insn_bitmap == (bitmap_t)0x0) {
LAB_00169157:
          plVar7 = loop;
          do {
            plVar7 = plVar7->parent;
            if (plVar7 == (loop_node_t)0x0) {
              return 0;
            }
          } while (plVar7 != *(loop_node_t *)(*(long *)(*(long *)(lVar3 + 0x30) + 0x98) + 0x18));
        }
        else {
          uVar1 = *(uint *)(lVar3 + 0xc);
          if ((loop_invariant_insn_bitmap->els_num << 6 <= (ulong)uVar1) ||
             ((loop_invariant_insn_bitmap->varr[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0))
          goto LAB_00169157;
        }
        iVar5 = input_insn_var_iterator_next(gen_ctx,&local_50,&local_5c,&local_60);
      } while (iVar5 != 0);
    }
  }
  return iVar4;
}

Assistant:

static int loop_invariant_p (gen_ctx_t gen_ctx, loop_node_t loop, bb_insn_t bb_insn,
                             bitmap_t loop_invariant_insn_bitmap) {
  MIR_insn_t insn = bb_insn->insn;
  bb_t bb = bb_insn->bb;
  loop_node_t curr_loop;
  int op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;

  if (MIR_any_branch_code_p (insn->code) || insn->code == MIR_PHI || insn->code == MIR_RET
      || insn->code == MIR_JRET || insn->code == MIR_LABEL || MIR_call_code_p (insn->code)
      || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART || insn->code == MIR_BEND
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG || insn->code == MIR_VA_BLOCK_ARG
      || insn->code == MIR_VA_END
      /* possible exception insns: */
      || insn->code == MIR_DIV || insn->code == MIR_DIVS || insn->code == MIR_UDIV
      || insn->code == MIR_UDIVS || insn->code == MIR_MOD || insn->code == MIR_MODS
      || insn->code == MIR_UMOD || insn->code == MIR_UMODS)
    return FALSE;
  for (size_t i = 0; i < insn->nops; i++) {
    if (insn->ops[i].mode == MIR_OP_VAR_MEM) return FALSE;
    if (insn->ops[i].mode == MIR_OP_VAR && bitmap_bit_p (tied_regs, insn->ops[i].u.var))
      return FALSE;
  }
  FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    se = insn->ops[op_num].data;
    gen_assert (se != NULL);
    bb_insn = se->def;
    if (loop_invariant_insn_bitmap != NULL
        && bitmap_bit_p (loop_invariant_insn_bitmap, bb_insn->index))
      continue;
    bb = bb_insn->bb;
    for (curr_loop = loop->parent; curr_loop != NULL; curr_loop = curr_loop->parent)
      if (curr_loop == bb->loop_node->parent) break;
    if (curr_loop == NULL) return FALSE;
  }
  return TRUE;
}